

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

QString * __thiscall
QUnicodeTables::convertCase<QString_const>
          (QString *__return_storage_ptr__,QUnicodeTables *this,QString *str,Case which)

{
  QStringIterator it;
  long lVar1;
  char32_t ucs4;
  Properties *pPVar2;
  Case which_00;
  long lVar3;
  const_iterator pQVar4;
  long in_FS_OFFSET;
  QStringIterator local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.i = *(const_iterator *)(this + 8);
  lVar1 = *(long *)(this + 0x10) * 2;
  do {
    lVar3 = lVar1;
    pQVar4 = local_48.i;
    if (lVar3 == 0) goto LAB_002f471c;
    lVar1 = lVar3 + -2;
  } while ((*(ushort *)((long)&local_48.i[-1].ucs + lVar3) & 0xfc00) == 0xd800);
  pQVar4 = (const_iterator)((long)&(local_48.i)->ucs + lVar3);
LAB_002f471c:
  local_48.pos = local_48.i;
  local_48.e = pQVar4;
  do {
    if (local_48.e <= local_48.pos) {
      QArrayDataPointer<char16_t>::QArrayDataPointer
                (&__return_storage_ptr__->d,(QArrayDataPointer<char16_t> *)this);
      goto LAB_002f4790;
    }
    ucs4 = QStringIterator::next(&local_48,L'�');
    pPVar2 = qGetProp(ucs4);
    which_00 = (Case)pQVar4;
  } while ((ushort)pPVar2->cases[(ulong)str & 0xffffffff] < 2);
  QStringIterator::recede(&local_48);
  it.pos = local_48.pos;
  it.i = local_48.i;
  it.e = local_48.e;
  detachAndConvertCase<QString_const>
            (__return_storage_ptr__,this,(QString *)((ulong)str & 0xffffffff),it,which_00);
LAB_002f4790:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

static QString convertCase(T &str, QUnicodeTables::Case which)
{
    const QChar *p = str.constBegin();
    const QChar *e = p + str.size();

    // this avoids out of bounds check in the loop
    while (e != p && e[-1].isHighSurrogate())
        --e;

    QStringIterator it(p, e);
    while (it.hasNext()) {
        const char32_t uc = it.next();
        if (qGetProp(uc)->cases[which].diff) {
            it.recede();
            return detachAndConvertCase(str, it, which);
        }
    }
    return std::move(str);
}